

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MFMSectorDump.cpp
# Opt level: O2

void __thiscall
Storage::Disk::MFMSectorDump::set_tracks
          (MFMSectorDump *this,
          map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
          *tracks)

{
  FileHolder *this_00;
  uint8_t first_sector;
  uint8_t sector_size;
  Density density;
  _Base_ptr track;
  undefined8 uVar1;
  _func_int *p_Var2;
  long lVar3;
  void *__buf;
  uint8_t *puVar4;
  byte last_sector;
  int iVar5;
  undefined4 extraout_var;
  pthread_mutex_t *__mutex;
  _Base_ptr p_Var6;
  size_t __n;
  undefined8 uStack_50;
  _Rb_tree_node_base *local_48;
  void *local_40;
  uint8_t *local_38;
  
  local_40 = (void *)(ulong)(uint)((0x80 << (this->sector_size_ & 0x1f)) * this->sectors_per_track_)
  ;
  lVar3 = -(long)local_40;
  local_38 = (uint8_t *)((long)&local_48 + lVar3);
  local_48 = &(tracks->_M_t)._M_impl.super__Rb_tree_header._M_header;
  this_00 = &this->file_;
  for (p_Var6 = (tracks->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left; puVar4 = local_38,
      p_Var6 != local_48; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    track = p_Var6[1]._M_parent;
    first_sector = this->first_sector_;
    last_sector = ((char)this->sectors_per_track_ + first_sector) - 1;
    sector_size = this->sector_size_;
    density = this->density_;
    __n = (size_t)last_sector;
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x3d87c3;
    decode_sectors((Track *)track,puVar4,first_sector,last_sector,sector_size,density);
    uVar1 = *(undefined8 *)(p_Var6 + 1);
    p_Var2 = (this->super_DiskImage)._vptr_DiskImage[9];
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x3d87d0;
    iVar5 = (*p_Var2)(this,uVar1);
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x3d87db;
    __mutex = (pthread_mutex_t *)FileHolder::get_file_access_mutex(this_00);
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x3d87e6;
    std::mutex::lock((mutex *)&__mutex->__data);
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x3d87f1;
    FileHolder::ensure_is_at_least_length(this_00,CONCAT44(extraout_var,iVar5));
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x3d87fe;
    FileHolder::seek(this_00,CONCAT44(extraout_var,iVar5),0);
    puVar4 = local_38;
    __buf = local_40;
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x3d880e;
    FileHolder::write(this_00,(int)puVar4,__buf,__n);
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x3d8816;
    pthread_mutex_unlock(__mutex);
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x3d881e;
  }
  *(undefined8 *)((long)&uStack_50 + lVar3) = 0x3d882e;
  FileHolder::flush(this_00);
  return;
}

Assistant:

void MFMSectorDump::set_tracks(const std::map<Track::Address, std::shared_ptr<Track>> &tracks) {
	uint8_t parsed_track[(128 << sector_size_)*sectors_per_track_];

	// TODO: it would be more efficient from a file access and locking point of view to parse the sectors
	// in one loop, then write in another.

	for(const auto &track : tracks) {
		decode_sectors(
			*track.second,
			parsed_track,
			first_sector_,
			first_sector_ + uint8_t(sectors_per_track_-1),
			sector_size_,
			density_);
		const long file_offset = get_file_offset_for_position(track.first);

		std::lock_guard lock_guard(file_.get_file_access_mutex());
		file_.ensure_is_at_least_length(file_offset);
		file_.seek(file_offset, SEEK_SET);
		file_.write(parsed_track, sizeof(parsed_track));
	}
	file_.flush();
}